

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Vector * __thiscall Matrix::operator*(Vector *__return_storage_ptr__,Matrix *this,Vector *other)

{
  int iVar1;
  size_type sVar2;
  runtime_error *this_00;
  reference pvVar3;
  double dVar4;
  Vector local_50;
  int local_38;
  int i;
  allocator<double> local_22;
  undefined1 local_21;
  Vector *local_20;
  Vector *other_local;
  Matrix *this_local;
  Vector *product;
  
  local_21 = 0;
  iVar1 = this->rows;
  local_20 = other;
  other_local = (Vector *)this;
  this_local = (Matrix *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_22);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,(long)iVar1,&local_22)
  ;
  std::allocator<double>::~allocator(&local_22);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_20);
  if (sVar2 == (long)this->cols) {
    for (local_38 = 0; local_38 < this->rows; local_38 = local_38 + 1) {
      GetRow(&local_50,this,local_38);
      dVar4 = Utils::ScalarMultiply(&local_50,local_20);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (__return_storage_ptr__,(long)local_38);
      *pvVar3 = dVar4;
      std::vector<double,_std::allocator<double>_>::~vector(&local_50);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vector Matrix::operator*(const Vector& other) const
{
    Vector product = Vector(rows);

    if (other.size() != cols)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    for (int i = 0; i < rows; ++i)
    {
        product[i] = Utils::ScalarMultiply(GetRow(i), other);
    }

    return product;
}